

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O3

string * __thiscall
flatbuffers::(anonymous_namespace)::LuaBfbsGenerator::GenerateMethod_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Field *field)

{
  Field FVar1;
  ulong uVar2;
  Field *pFVar3;
  string *extraout_RAX;
  string *psVar4;
  string *extraout_RAX_00;
  char *pcVar5;
  char *pcVar6;
  string local_40;
  
  if ((*(ushort *)(field + -(long)*(int *)field) < 7) ||
     (uVar2 = (ulong)*(ushort *)(field + (6 - (long)*(int *)field)), uVar2 == 0)) {
    pFVar3 = (Field *)0x0;
  }
  else {
    pFVar3 = field + *(uint *)(field + uVar2) + uVar2;
  }
  if ((4 < *(ushort *)(pFVar3 + -(long)*(int *)pFVar3)) &&
     ((ulong)*(ushort *)(pFVar3 + (4 - (long)*(int *)pFVar3)) != 0)) {
    FVar1.super_Table = pFVar3[*(ushort *)(pFVar3 + (4 - (long)*(int *)pFVar3))].super_Table;
    if ((int)(char)FVar1.super_Table - 1U < 0xc) {
      GenerateType_abi_cxx11_
                (&local_40,(void *)(ulong)(uint)(int)(char)FVar1.super_Table,
                 (BaseType)(pFVar3 + -(long)*(int *)pFVar3));
      (**(code **)(*(long *)((long)this + 0xe8) + 0xa0))
                (__return_storage_ptr__,(long)this + 0xe8,&local_40,
                 *(undefined4 *)((long)this + 0xf0));
      psVar4 = (string *)&local_40.field_2;
      if ((string *)local_40._M_dataplus._M_p != psVar4) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        psVar4 = extraout_RAX;
      }
      return psVar4;
    }
    if (FVar1.super_Table == (Table)0xf) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "Struct";
      pcVar5 = "";
      goto LAB_003252c3;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar6 = "UOffsetTRelative";
  pcVar5 = "";
LAB_003252c3:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar6,pcVar5);
  return extraout_RAX_00;
}

Assistant:

std::string GenerateMethod(const r::Field *field) const {
    const r::BaseType base_type = field->type()->base_type();
    if (IsScalar(base_type)) { return namer_.Type(GenerateType(base_type)); }
    if (IsStructOrTable(base_type)) { return "Struct"; }
    return "UOffsetTRelative";
  }